

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,Allocator *_allocator)

{
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Allocator *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  Mat *in_stack_ffffffffffffff00;
  int local_c8;
  
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] == in_EDX) {
    if (((int)in_RSI[5] < 3) ||
       (in_RSI[8] ==
        (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
        (long)*(int *)((long)in_RSI + 0x34))) {
      in_RDI->data = (void *)*in_RSI;
      in_RDI->refcount = (int *)in_RSI[1];
      in_RDI->elemsize = in_RSI[2];
      in_RDI->elempack = (int)in_RSI[3];
      in_RDI->allocator = (Allocator *)in_RSI[4];
      in_RDI->dims = (int)in_RSI[5];
      in_RDI->w = *(int *)((long)in_RSI + 0x2c);
      in_RDI->h = (int)in_RSI[6];
      in_RDI->d = *(int *)((long)in_RSI + 0x34);
      in_RDI->c = (int)in_RSI[7];
      in_RDI->cstep = in_RSI[8];
      if (in_RDI->refcount != (int *)0x0) {
        LOCK();
        *in_RDI->refcount = *in_RDI->refcount + 1;
        UNLOCK();
      }
      in_RDI->dims = 1;
      in_RDI->w = in_EDX;
      in_RDI->h = 1;
      in_RDI->d = 1;
      in_RDI->c = 1;
      in_RDI->cstep = (long)in_EDX;
    }
    else {
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
      create(in_stack_ffffffffffffff00,(int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffef0,
             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_fffffffffffffee0);
      for (local_c8 = 0; local_c8 < (int)in_RSI[7]; local_c8 = local_c8 + 1) {
        memcpy((void *)((long)in_RDI->data +
                       (long)local_c8 * (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
                       (long)*(int *)((long)in_RSI + 0x34) * in_RSI[2]),
               (void *)(*in_RSI + (long)local_c8 * in_RSI[8] * in_RSI[2]),
               (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
               (long)*(int *)((long)in_RSI + 0x34) * in_RSI[2]);
      }
    }
  }
  else {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, Allocator* _allocator) const
{
    if (w * h * d * c != _w)
        return Mat();

    if (dims >= 3 && cstep != (size_t)w * h * d)
    {
        Mat m;
        m.create(_w, elemsize, elempack, _allocator);

        // flatten
        for (int i = 0; i < c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + (size_t)i * w * h * d * elemsize;
            memcpy(mptr, ptr, (size_t)w * h * d * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.d = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}